

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O3

unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> __thiscall
duckdb::LocalFileSystem::OpenFile
          (LocalFileSystem *this,string *path_p,FileOpenFlags flags,
          optional_ptr<duckdb::FileOpener,_true> opener)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_> _Var2;
  _Alloc_hider _Var3;
  int iVar4;
  uint uVar5;
  FileType FVar6;
  uint uVar7;
  int iVar8;
  idx_t iVar9;
  Logger *this_00;
  uint *puVar10;
  int *piVar11;
  undefined8 *puVar12;
  NotImplementedException *this_01;
  InternalException *this_02;
  char *pcVar13;
  IOException *pIVar14;
  uint uVar15;
  uint uVar16;
  undefined8 uVar17;
  char cVar18;
  optional_ptr<duckdb::FileOpener,_true> in_R9;
  string extended_error;
  string path;
  undefined1 local_1c3;
  undefined1 local_1c2;
  undefined1 local_1c1;
  string *local_1c0;
  __uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_> local_1b8;
  string local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  optional_ptr<duckdb::FileOpener,_true> local_150;
  string local_148;
  string local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  
  local_1c0 = path_p;
  local_1b8._M_t.
  super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
  super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl =
       (tuple<duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>)
       (tuple<duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>)this;
  local_150.ptr = in_R9.ptr;
  FileSystem::ExpandPath(&local_128,(string *)flags.flags,in_R9);
  _Var3._M_p = local_128._M_dataplus._M_p;
  iVar9 = GetFileUrlOffset(&local_128);
  if (((uint)opener.ptr & 0xff00) != 0x100) {
    this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_190.first._M_dataplus._M_p = (pointer)&local_190.first.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_190,"Unsupported compression type for default file system","");
    NotImplementedException::NotImplementedException(this_01,&local_190.first);
    __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (in_R9.ptr != (FileOpener *)0x0) {
    optional_ptr<duckdb::FileOpener,_true>::CheckValid(&local_150);
    this_00 = Logger::Get(local_150.ptr);
    iVar4 = (*this_00->_vptr_Logger[2])(this_00,"duckdb.FileSystem.LocalFileSystem.OpenFile",0x1e);
    if ((char)iVar4 != '\0') {
      Logger::WriteLog(this_00,"duckdb.FileSystem.LocalFileSystem.OpenFile",LOG_INFO,
                       (string *)flags.flags);
    }
  }
  uVar7 = flags._8_4_;
  uVar5 = 1;
  if (((undefined1  [16])flags & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    uVar5 = (uint)((uVar7 & 3) == 3) * 2;
  }
  if (((undefined1  [16])flags & (undefined1  [16])0x3) == (undefined1  [16])0x0) {
    this_02 = (InternalException *)__cxa_allocate_exception(0x10);
    local_190.first._M_dataplus._M_p = (pointer)&local_190.first.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_190,"READ, WRITE or both should be specified when opening a file",""
              );
    InternalException::InternalException(this_02,&local_190.first);
    __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (((undefined1  [16])flags & (undefined1  [16])0x2) != (undefined1  [16])0x0) {
    uVar16 = 0x80240;
    if (((undefined1  [16])flags & (undefined1  [16])0x10) == (undefined1  [16])0x0) {
      uVar16 = 0x80000;
    }
    uVar15 = 0x80040;
    if (((undefined1  [16])flags & (undefined1  [16])0x8) == (undefined1  [16])0x0) {
      uVar15 = uVar16;
    }
    uVar5 = uVar5 | (uVar7 & 0x20) << 5 | uVar15;
  }
  uVar5 = (uVar7 & 4) << 0xc | uVar5;
  uVar17 = 0x180;
  if (((undefined1  [16])flags & (undefined1  [16])0x40) == (undefined1  [16])0x0) {
    uVar17 = 0x1b6;
  }
  uVar16 = uVar5 | 0x80;
  if (((undefined1  [16])flags & (undefined1  [16])0x240) == (undefined1  [16])0x0) {
    uVar16 = uVar5;
  }
  iVar4 = open(_Var3._M_p + iVar9,uVar16,uVar17);
  if (iVar4 != -1) {
    cVar18 = (char)opener.ptr;
    if (cVar18 != '\0') {
      FVar6 = GetFileTypeInternal(iVar4);
      if (FVar6 - FILE_TYPE_LINK < 0xfffffffe) {
        local_148.field_2._8_8_ = 0;
        local_148._M_dataplus._M_p._1_7_ = 0;
        local_148._M_dataplus._M_p._0_1_ = cVar18 != '\x01';
        local_148._M_string_length = 0;
        local_148.field_2._M_allocated_capacity = 0;
        uVar7 = fcntl(iVar4,6);
        puVar10 = (uint *)__errno_location();
        uVar5 = *puVar10;
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        local_1b0._M_string_length = 0;
        local_1b0.field_2._M_local_buf[0] = '\0';
        uVar16 = uVar5 ^ 0x5f | ~uVar7;
        if (uVar16 == 0) {
          if (cVar18 != '\x01') {
            uVar16 = 0x1dba89c;
            ::std::__cxx11::string::_M_replace((ulong)&local_1b0,0,(char *)0x0,0x1dba89c);
            if (local_1b0._M_string_length != 0) goto LAB_00e609eb;
LAB_00e60949:
            iVar8 = fcntl(iVar4,5,&local_148);
            if (iVar8 == -1) {
              pcVar13 = strerror(*puVar10);
              ::std::__cxx11::string::operator=((string *)&local_1b0,pcVar13);
            }
            else {
              AdditionalProcessInfo_abi_cxx11_
                        (&local_190.first,(duckdb *)local_1c0,
                         (FileSystem *)(local_148.field_2._8_8_ & 0xffffffff),uVar16);
              ::std::__cxx11::string::operator=((string *)&local_1b0,(string *)&local_190);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190.first._M_dataplus._M_p != &local_190.first.field_2) {
                operator_delete(local_190.first._M_dataplus._M_p);
              }
            }
            if (cVar18 == '\x02') {
              local_148._M_dataplus._M_p = local_148._M_dataplus._M_p & 0xffffffffffff0000;
              iVar8 = fcntl(iVar4,6);
              if (iVar8 != -1) {
                ::std::__cxx11::string::append((char *)&local_1b0);
              }
            }
LAB_00e609eb:
            iVar4 = close(iVar4);
            if (iVar4 == -1) {
              ::std::__cxx11::string::append((char *)&local_1b0);
            }
            ::std::__cxx11::string::append((char *)&local_1b0);
            pIVar14 = (IOException *)__cxa_allocate_exception(0x10);
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_108,"Could not set lock on file \"%s\": %s","");
            std::__cxx11::to_string(&local_a8,uVar5);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      (&local_190,(char (*) [6])"errno",&local_a8);
            ::std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&local_68,&local_190,&local_150,0,&local_1c3,&local_1c1,&local_1c2);
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c8,local_128._M_dataplus._M_p,
                       local_128._M_dataplus._M_p + local_128._M_string_length);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_e8,local_1b0._M_dataplus._M_p,
                       local_1b0._M_dataplus._M_p + local_1b0._M_string_length);
            IOException::IOException<std::__cxx11::string,std::__cxx11::string>
                      (pIVar14,&local_108,&local_68,&local_c8,&local_e8);
            __cxa_throw(pIVar14,&IOException::typeinfo,::std::runtime_error::~runtime_error);
          }
          *puVar10 = 0;
        }
        else if (uVar7 == 0xffffffff) goto LAB_00e60949;
      }
    }
    puVar12 = (undefined8 *)operator_new(0x48);
    paVar1 = &local_190.first.field_2;
    local_190.first._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_190,local_128._M_dataplus._M_p,
               local_128._M_dataplus._M_p + local_128._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190.first._M_dataplus._M_p == paVar1) {
      puVar12[1] = local_1c0;
      puVar12[2] = puVar12 + 4;
      puVar12[4] = local_190.first.field_2._M_allocated_capacity;
      puVar12[5] = local_190.first.field_2._8_8_;
    }
    else {
      puVar12[1] = local_1c0;
      puVar12[2] = local_190.first._M_dataplus._M_p;
      puVar12[4] = local_190.first.field_2._M_allocated_capacity;
    }
    puVar12[3] = local_190.first._M_string_length;
    puVar12[6] = flags._8_8_;
    puVar12[7] = opener.ptr;
    *puVar12 = &PTR__UnixFileHandle_0243e7c8;
    *(int *)(puVar12 + 8) = iVar4;
    goto LAB_00e6072f;
  }
  if ((char)flags.lock < '\0') {
    piVar11 = __errno_location();
    if (*piVar11 != 2) goto LAB_00e60666;
  }
  else {
LAB_00e60666:
    if ((uVar7 >> 10 & 1) == 0) {
LAB_00e60818:
      pIVar14 = (IOException *)__cxa_allocate_exception(0x10);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_148,"Cannot open file \"%s\": %s","");
      piVar11 = __errno_location();
      std::__cxx11::to_string(&local_1b0,*piVar11);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_190,(char (*) [6])"errno",&local_1b0);
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&local_68,&local_190,&local_150,0,&local_108,&local_a8,&local_1c3);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,local_128._M_dataplus._M_p,
                 local_128._M_dataplus._M_p + local_128._M_string_length);
      pcVar13 = strerror(*piVar11);
      IOException::IOException<std::__cxx11::string,char*>
                (pIVar14,&local_148,&local_68,&local_88,pcVar13);
      __cxa_throw(pIVar14,&IOException::typeinfo,::std::runtime_error::~runtime_error);
    }
    piVar11 = __errno_location();
    if (*piVar11 != 0x11) goto LAB_00e60818;
  }
  puVar12 = (undefined8 *)0x0;
LAB_00e6072f:
  _Var2._M_t.super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
  super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl =
       local_1b8._M_t.
       super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
       super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl;
  *(undefined8 **)
   local_1b8._M_t.
   super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
   super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl = puVar12;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)
         (_Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>)
         _Var2._M_t.
         super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
         super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<FileHandle> LocalFileSystem::OpenFile(const string &path_p, FileOpenFlags flags,
                                                 optional_ptr<FileOpener> opener) {
	auto path = FileSystem::ExpandPath(path_p, opener);
	auto normalized_path = NormalizeLocalPath(path);
	if (flags.Compression() != FileCompressionType::UNCOMPRESSED) {
		throw NotImplementedException("Unsupported compression type for default file system");
	}

	if (opener) {
		DUCKDB_LOG_INFO(*opener, "duckdb.FileSystem.LocalFileSystem.OpenFile", path_p);
	}

	flags.Verify();

	int open_flags = 0;
	int rc;
	bool open_read = flags.OpenForReading();
	bool open_write = flags.OpenForWriting();
	if (open_read && open_write) {
		open_flags = O_RDWR;
	} else if (open_read) {
		open_flags = O_RDONLY;
	} else if (open_write) {
		open_flags = O_WRONLY;
	} else {
		throw InternalException("READ, WRITE or both should be specified when opening a file");
	}
	if (open_write) {
		// need Read or Write
		D_ASSERT(flags.OpenForWriting());
		open_flags |= O_CLOEXEC;
		if (flags.CreateFileIfNotExists()) {
			open_flags |= O_CREAT;
		} else if (flags.OverwriteExistingFile()) {
			open_flags |= O_CREAT | O_TRUNC;
		}
		if (flags.OpenForAppending()) {
			open_flags |= O_APPEND;
		}
	}
	if (flags.DirectIO()) {
#if defined(__sun) && defined(__SVR4)
		throw InvalidInputException("DIRECT_IO not supported on Solaris");
#endif
#if defined(__DARWIN__) || defined(__APPLE__) || defined(__OpenBSD__)
		// OSX does not have O_DIRECT, instead we need to use fcntl afterwards to support direct IO
#else
		open_flags |= O_DIRECT;
#endif
	}

	// Determine permissions
	mode_t filesec;
	if (flags.CreatePrivateFile()) {
		open_flags |= O_EXCL; // Ensure we error on existing files or the permissions may not set
		filesec = 0600;
	} else {
		filesec = 0666;
	}

	if (flags.ExclusiveCreate()) {
		open_flags |= O_EXCL;
	}

	// Open the file
	int fd = open(normalized_path, open_flags, filesec);

	if (fd == -1) {
		if (flags.ReturnNullIfNotExists() && errno == ENOENT) {
			return nullptr;
		}
		if (flags.ReturnNullIfExists() && errno == EEXIST) {
			return nullptr;
		}
		throw IOException("Cannot open file \"%s\": %s", {{"errno", std::to_string(errno)}}, path, strerror(errno));
	}

#if defined(__DARWIN__) || defined(__APPLE__)
	if (flags.DirectIO()) {
		// OSX requires fcntl for Direct IO
		rc = fcntl(fd, F_NOCACHE, 1);
		if (rc == -1) {
			throw IOException("Could not enable direct IO for file \"%s\": %s", path, strerror(errno));
		}
	}
#endif

	if (flags.Lock() != FileLockType::NO_LOCK) {
		// set lock on file
		// but only if it is not an input/output stream
		auto file_type = GetFileTypeInternal(fd);
		if (file_type != FileType::FILE_TYPE_FIFO && file_type != FileType::FILE_TYPE_SOCKET) {
			struct flock fl;
			memset(&fl, 0, sizeof fl);
			fl.l_type = flags.Lock() == FileLockType::READ_LOCK ? F_RDLCK : F_WRLCK;
			fl.l_whence = SEEK_SET;
			fl.l_start = 0;
			fl.l_len = 0;
			rc = fcntl(fd, F_SETLK, &fl);
			// Retain the original error.
			int retained_errno = errno;
			bool has_error = rc == -1;
			string extended_error;
			if (has_error) {
				if (retained_errno == ENOTSUP) {
					// file lock not supported for this file system
					if (flags.Lock() == FileLockType::READ_LOCK) {
						// for read-only, we ignore not-supported errors
						has_error = false;
						errno = 0;
					} else {
						extended_error = "File locks are not supported for this file system, cannot open the file in "
						                 "read-write mode. Try opening the file in read-only mode";
					}
				}
			}
			if (has_error) {
				if (extended_error.empty()) {
					// try to find out who is holding the lock using F_GETLK
					rc = fcntl(fd, F_GETLK, &fl);
					if (rc == -1) { // fnctl does not want to help us
						extended_error = strerror(errno);
					} else {
						extended_error = AdditionalProcessInfo(*this, fl.l_pid);
					}
					if (flags.Lock() == FileLockType::WRITE_LOCK) {
						// maybe we can get a read lock instead and tell this to the user.
						fl.l_type = F_RDLCK;
						rc = fcntl(fd, F_SETLK, &fl);
						if (rc != -1) { // success!
							extended_error +=
							    ". However, you would be able to open this database in read-only mode, e.g. by "
							    "using the -readonly parameter in the CLI";
						}
					}
				}
				rc = close(fd);
				if (rc == -1) {
					extended_error += ". Also, failed closing file";
				}
				extended_error += ". See also https://duckdb.org/docs/stable/connect/concurrency";
				throw IOException("Could not set lock on file \"%s\": %s", {{"errno", std::to_string(retained_errno)}},
				                  path, extended_error);
			}
		}
	}
	return make_uniq<UnixFileHandle>(*this, path, fd, flags);
}